

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O3

size_t ClownLZSS::Internal::KosinskiPlus::GetMatchCost(size_t distance,size_t length,void *user)

{
  size_t sVar1;
  
  sVar1 = 0xc;
  if ((0x100 < distance || 3 < length - 2) && (sVar1 = 0x12, 6 < length - 3)) {
    sVar1 = 0x1a;
    if (length < 10) {
      sVar1 = 0;
    }
  }
  return sVar1;
}

Assistant:

inline std::size_t GetMatchCost(const std::size_t distance, const std::size_t length, [[maybe_unused]] void* const user)
			{
				if (length >= 2 && length <= 5 && distance <= 0x100)
					return 2 + 8 + 2;  // Descriptor bits, offset byte, length bits.
				else if (length >= 3 && length <= 9)
					return 2 + 16;     // Descriptor bits, offset/length bytes.
				else if (length >= 10)
					return 2 + 16 + 8; // Descriptor bits, offset bytes, length byte.
				else
					return 0;          // In the event a match cannot be compressed.
			}